

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O1

void __thiscall SPUserNotice::Encode(SPUserNotice *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  ulong cbData;
  size_t sVar1;
  long lVar2;
  uchar *puVar3;
  undefined1 auStack_58 [8];
  EncodeHelper eh;
  
  auStack_58 = (undefined1  [8])0x0;
  eh.offset = 0;
  eh.cbNeeded = 0;
  cbData = (this->super_DerBase).cbData;
  lVar2 = 2;
  if ((((0x7f < cbData) && (lVar2 = 3, 0xff < cbData)) && (lVar2 = 4, 0xffff < cbData)) &&
     (((lVar2 = 5, 0xffffff < cbData && (lVar2 = 6, cbData >> 0x20 != 0)) &&
      (lVar2 = 7, cbData >> 0x28 != 0)))) {
    lVar2 = (ulong)(cbData >> 0x30 == 0) << 3;
  }
  eh.cbCurrent = (size_t)cbUsed;
  EncodeHelper::Init((EncodeHelper *)auStack_58,lVar2 + cbData,pOut,cbOut,'0',cbData);
  puVar3 = pOut + (long)auStack_58;
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  NoticeReference::Encode(&this->noticeRef,puVar3,sVar1,&eh.cbNeeded);
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  puVar3 = pOut + (long)auStack_58;
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  AnyType::Encode(&(this->explicitText).value,puVar3,sVar1,&eh.cbNeeded);
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  EncodeHelper::CheckExit((EncodeHelper *)auStack_58);
  *(undefined1 (*) [8])eh.cbCurrent = auStack_58;
  return;
}

Assistant:

void SPUserNotice::Encode(unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
    EncodeHelper eh(cbUsed);

    eh.Init(EncodedSize(), pOut, cbOut, static_cast<unsigned char>(DerType::ConstructedSequence), cbData);

    noticeRef.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Update();

    explicitText.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Finalize();
}